

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlElementTypeVal type,
                 xmlElementContentPtr content)

{
  int iVar1;
  xmlDictPtr pxVar2;
  xmlDictPtr pxStack_68;
  int res;
  xmlDictPtr dict;
  xmlChar *prefix;
  xmlChar *localName;
  xmlAttributePtr oldAttributes;
  xmlElementTablePtr table;
  xmlElementPtr ret;
  xmlElementContentPtr content_local;
  xmlChar *pxStack_28;
  xmlElementTypeVal type_local;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  xmlValidCtxtPtr ctxt_local;
  
  localName = (xmlChar *)0x0;
  dict = (xmlDictPtr)0x0;
  if (dtd == (xmlDtdPtr)0x0) {
    return (xmlElementPtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    return (xmlElementPtr)0x0;
  }
  ret = (xmlElementPtr)content;
  content_local._4_4_ = type;
  pxStack_28 = name;
  name_local = (xmlChar *)dtd;
  dtd_local = (xmlDtdPtr)ctxt;
  if (2 < type - XML_ELEMENT_TYPE_EMPTY && type != XML_ELEMENT_TYPE_ELEMENT) {
    xmlErrValid(ctxt,XML_ERR_ARGUMENT,"xmlAddElementDecl: invalid type\n",(char *)0x0);
    return (xmlElementPtr)0x0;
  }
  switch((long)&switchD_001759ec::switchdataD_0023b8cc +
         (long)(int)(&switchD_001759ec::switchdataD_0023b8cc)[type - XML_ELEMENT_TYPE_EMPTY]) {
  case 0x1759ee:
    if (content != (xmlElementContentPtr)0x0) {
      xmlErrValid(ctxt,XML_DTD_CONTENT_ERROR,"xmlAddElementDecl: content != NULL for EMPTY\n",
                  (char *)0x0);
      return (xmlElementPtr)0x0;
    }
    break;
  case 0x175a20:
    if (content != (xmlElementContentPtr)0x0) {
      xmlErrValid(ctxt,XML_DTD_CONTENT_ERROR,"xmlAddElementDecl: content != NULL for ANY\n",
                  (char *)0x0);
      return (xmlElementPtr)0x0;
    }
    break;
  case 0x175a52:
    if (content == (xmlElementContentPtr)0x0) {
      xmlErrValid(ctxt,XML_DTD_CONTENT_ERROR,"xmlAddElementDecl: content == NULL for MIXED\n",
                  (char *)0x0);
      return (xmlElementPtr)0x0;
    }
    break;
  case 0x175a81:
    if (content == (xmlElementContentPtr)0x0) {
      xmlErrValid(ctxt,XML_DTD_CONTENT_ERROR,"xmlAddElementDecl: content == NULL for ELEMENT\n",
                  (char *)0x0);
      return (xmlElementPtr)0x0;
    }
  }
  prefix = xmlSplitQName4(name,(xmlChar **)&dict);
  if (prefix == (xmlChar *)0x0) goto LAB_00175e41;
  oldAttributes = *(xmlAttributePtr *)(name_local + 0x50);
  if (oldAttributes == (xmlAttributePtr)0x0) {
    pxStack_68 = (xmlDictPtr)0x0;
    if (*(long *)(name_local + 0x40) != 0) {
      pxStack_68 = *(xmlDictPtr *)(*(long *)(name_local + 0x40) + 0x98);
    }
    oldAttributes = (xmlAttributePtr)xmlHashCreateDict(0,pxStack_68);
    if (oldAttributes == (xmlAttributePtr)0x0) goto LAB_00175e41;
    *(xmlAttributePtr *)(name_local + 0x50) = oldAttributes;
  }
  if ((((*(long *)(name_local + 0x40) != 0) && (*(long *)(*(long *)(name_local + 0x40) + 0x50) != 0)
       ) && (table = (xmlElementTablePtr)
                     xmlHashLookup2(*(xmlHashTablePtr *)
                                     (*(long *)(*(long *)(name_local + 0x40) + 0x50) + 0x50),prefix,
                                    (xmlChar *)dict), table != (xmlElementTablePtr)0x0)) &&
     (table[2].size == 0)) {
    localName = *(xmlChar **)&table[2].randomSeed;
    *(undefined8 *)&table[2].randomSeed = 0;
    xmlHashRemoveEntry2(*(xmlHashTablePtr *)(*(long *)(*(long *)(name_local + 0x40) + 0x50) + 0x50),
                        prefix,(xmlChar *)dict,(xmlHashDeallocator)0x0);
    xmlFreeElement((xmlElementPtr)table);
  }
  table = (xmlElementTablePtr)xmlHashLookup2((xmlHashTablePtr)oldAttributes,prefix,(xmlChar *)dict);
  if (table == (xmlElementTablePtr)0x0) {
    table = (xmlElementTablePtr)(*xmlMalloc)(0x70);
    if (table == (xmlElementTablePtr)0x0) goto LAB_00175e41;
    memset(table,0,0x70);
    table->size = 0xf;
    pxVar2 = (xmlDictPtr)xmlStrdup(prefix);
    table->dict = pxVar2;
    if (table->dict == (xmlDictPtr)0x0) {
      (*xmlFree)(table);
      goto LAB_00175e41;
    }
    table[3].table = (xmlHashEntry *)dict;
    dict = (xmlDictPtr)0x0;
    iVar1 = xmlHashAdd2((xmlHashTablePtr)oldAttributes,prefix,(xmlChar *)table[3].table,table);
    if (iVar1 < 1) {
      xmlFreeElement((xmlElementPtr)table);
      goto LAB_00175e41;
    }
    *(xmlChar **)&table[2].randomSeed = localName;
  }
  else {
    if (table[2].size != 0) {
      xmlErrValidNode((xmlValidCtxtPtr)dtd_local,(xmlNodePtr)name_local,XML_DTD_ELEM_REDEFINED,
                      "Redefinition of element %s\n",pxStack_28,(xmlChar *)0x0,(xmlChar *)0x0);
      if (dict != (xmlDictPtr)0x0) {
        (*xmlFree)(dict);
      }
      return (xmlElementPtr)0x0;
    }
    if (dict != (xmlDictPtr)0x0) {
      (*xmlFree)(dict);
      dict = (xmlDictPtr)0x0;
    }
  }
  table[2].size = content_local._4_4_;
  if (ret != (xmlElementPtr)0x0) {
    if ((dtd_local == (xmlDtdPtr)0x0) || (((ulong)dtd_local->next & 2) == 0)) {
      if (ret != (xmlElementPtr)0x0) {
        pxVar2 = (xmlDictPtr)
                 xmlCopyDocElementContent
                           (*(xmlDocPtr *)(name_local + 0x40),(xmlElementContentPtr)ret);
        table[2].dict = pxVar2;
        if (table[2].dict == (xmlDictPtr)0x0) {
LAB_00175e41:
          xmlVErrMemory((xmlValidCtxtPtr)dtd_local);
          if (dict != (xmlDictPtr)0x0) {
            (*xmlFree)(dict);
          }
          return (xmlElementPtr)0x0;
        }
      }
    }
    else {
      table[2].dict = (xmlDictPtr)ret;
      ret->last = (_xmlNode *)0x1;
    }
  }
  *(xmlChar **)&table[1].size = name_local;
  table[2].table = *(xmlHashEntry **)(name_local + 0x40);
  if (*(long *)(name_local + 0x20) == 0) {
    *(xmlElementTablePtr *)(name_local + 0x20) = table;
    *(xmlElementTablePtr *)(name_local + 0x18) = table;
  }
  else {
    *(xmlElementTablePtr *)(*(long *)(name_local + 0x20) + 0x30) = table;
    *(undefined8 *)&table[1].randomSeed = *(undefined8 *)(name_local + 0x20);
    *(xmlElementTablePtr *)(name_local + 0x20) = table;
  }
  if (dict != (xmlDictPtr)0x0) {
    (*xmlFree)(dict);
  }
  return (xmlElementPtr)table;
}

Assistant:

xmlElementPtr
xmlAddElementDecl(xmlValidCtxtPtr ctxt,
                  xmlDtdPtr dtd, const xmlChar *name,
                  xmlElementTypeVal type,
		  xmlElementContentPtr content) {
    xmlElementPtr ret;
    xmlElementTablePtr table;
    xmlAttributePtr oldAttributes = NULL;
    const xmlChar *localName;
    xmlChar *prefix = NULL;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }

    switch (type) {
        case XML_ELEMENT_TYPE_EMPTY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content != NULL for EMPTY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    if (content != NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content != NULL for ANY\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content == NULL for MIXED\n",
			NULL);
		return(NULL);
	    }
	    break;
	case XML_ELEMENT_TYPE_ELEMENT:
	    if (content == NULL) {
		xmlErrValid(ctxt, XML_DTD_CONTENT_ERROR,
		        "xmlAddElementDecl: content == NULL for ELEMENT\n",
			NULL);
		return(NULL);
	    }
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_ARGUMENT,
		    "xmlAddElementDecl: invalid type\n", NULL);
	    return(NULL);
    }

    /*
     * check if name is a QName
     */
    localName = xmlSplitQName4(name, &prefix);
    if (localName == NULL)
        goto mem_error;

    /*
     * Create the Element table if needed.
     */
    table = (xmlElementTablePtr) dtd->elements;
    if (table == NULL) {
	xmlDictPtr dict = NULL;

	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;
        table = xmlHashCreateDict(0, dict);
        if (table == NULL)
            goto mem_error;
	dtd->elements = (void *) table;
    }

    /*
     * lookup old attributes inserted on an undefined element in the
     * internal subset.
     */
    if ((dtd->doc != NULL) && (dtd->doc->intSubset != NULL)) {
	ret = xmlHashLookup2(dtd->doc->intSubset->elements, localName, prefix);
	if ((ret != NULL) && (ret->etype == XML_ELEMENT_TYPE_UNDEFINED)) {
	    oldAttributes = ret->attributes;
	    ret->attributes = NULL;
	    xmlHashRemoveEntry2(dtd->doc->intSubset->elements, localName, prefix,
                                NULL);
	    xmlFreeElement(ret);
	}
    }

    /*
     * The element may already be present if one of its attribute
     * was registered first
     */
    ret = xmlHashLookup2(table, localName, prefix);
    if (ret != NULL) {
	if (ret->etype != XML_ELEMENT_TYPE_UNDEFINED) {
#ifdef LIBXML_VALID_ENABLED
	    /*
	     * The element is already defined in this DTD.
	     */
	    xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ELEM_REDEFINED,
	                    "Redefinition of element %s\n",
			    name, NULL, NULL);
#endif /* LIBXML_VALID_ENABLED */
            if (prefix != NULL)
	        xmlFree(prefix);
	    return(NULL);
	}
	if (prefix != NULL) {
	    xmlFree(prefix);
	    prefix = NULL;
	}
    } else {
        int res;

	ret = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
	if (ret == NULL)
            goto mem_error;
	memset(ret, 0, sizeof(xmlElement));
	ret->type = XML_ELEMENT_DECL;

	/*
	 * fill the structure.
	 */
	ret->name = xmlStrdup(localName);
	if (ret->name == NULL) {
	    xmlFree(ret);
	    goto mem_error;
	}
	ret->prefix = prefix;
        prefix = NULL;

	/*
	 * Validity Check:
	 * Insertion must not fail
	 */
        res = xmlHashAdd2(table, localName, ret->prefix, ret);
        if (res <= 0) {
	    xmlFreeElement(ret);
            goto mem_error;
	}
	/*
	 * For new element, may have attributes from earlier
	 * definition in internal subset
	 */
	ret->attributes = oldAttributes;
    }

    /*
     * Finish to fill the structure.
     */
    ret->etype = type;
    /*
     * Avoid a stupid copy when called by the parser
     * and flag it by setting a special parent value
     * so the parser doesn't unallocate it.
     */
    if (content != NULL) {
        if ((ctxt != NULL) && (ctxt->flags & XML_VCTXT_USE_PCTXT)) {
            ret->content = content;
            content->parent = (xmlElementContentPtr) 1;
        } else if (content != NULL){
            ret->content = xmlCopyDocElementContent(dtd->doc, content);
            if (ret->content == NULL)
                goto mem_error;
        }
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    if (prefix != NULL)
	xmlFree(prefix);
    return(ret);

mem_error:
    xmlVErrMemory(ctxt);
    if (prefix != NULL)
        xmlFree(prefix);
    return(NULL);
}